

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

string<unsigned_long> * __thiscall
irr::core::string<unsigned_long>::operator=(string<unsigned_long> *this,char *c)

{
  char *pcVar1;
  s32 l;
  ulong uVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  
  puVar3 = this->array;
  if (c == (char *)0x0) {
    if (puVar3 == (unsigned_long *)0x0) {
      puVar3 = (unsigned_long *)operator_new__(8);
      this->array = puVar3;
      this->allocated = 1;
      this->used = 1;
    }
    *puVar3 = 0;
  }
  else if (puVar3 != (unsigned_long *)c) {
    if (*c == '\0') {
      uVar2 = 1;
    }
    else {
      uVar2 = 1;
      do {
        pcVar1 = c + uVar2;
        uVar2 = uVar2 + 1;
      } while (*pcVar1 != '\0');
    }
    this->used = (s32)uVar2;
    this->allocated = (s32)uVar2;
    puVar4 = (unsigned_long *)operator_new__((uVar2 & 0xffffffff) * 8);
    this->array = puVar4;
    uVar5 = 0;
    do {
      this->array[uVar5] = (long)c[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uVar2 & 0xffffffff) != uVar5);
    if (puVar3 != (unsigned_long *)0x0) {
      operator_delete__(puVar3);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const B* c) 
	{
		if (!c)
		{
			if (!array)
			{
				array = new T[1];
				allocated = 1;
				used = 1;
			}
			array[0] = 0x0;
			return *this;
		}

		if ((void*)c == (void*)array)
			return *this;

		s32 len = 0;
		const B* p = c;
		while(*p)
		{
			++len;
			++p;
		}

		// we'll take the old string for a while, because the new string could be
		// a part of the current string.
		T* oldArray = array;

        allocated = used = len+1;
		array = new T[used];

		for (s32 l = 0; l<len+1; ++l)
			array[l] = (T)c[l];

		delete [] oldArray;
		return *this;
	}